

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_string.cpp
# Opt level: O1

void duckdb::StringDecompressFunction<unsigned_int>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  ulong *puVar1;
  VectorType VVar2;
  uint uVar3;
  idx_t count;
  uint *puVar4;
  uint *puVar5;
  unsigned_long *puVar6;
  string_t *psVar7;
  allocate_function_ptr_t p_Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  byte bVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  undefined8 uVar19;
  SelectionVector *pSVar20;
  reference vector;
  VectorBuffer *pVVar21;
  ulong uVar22;
  TemplatedValidityData<unsigned_long> *pTVar23;
  idx_t iVar24;
  idx_t iVar25;
  void *in_R9;
  idx_t idx_in_entry;
  ulong uVar26;
  data_ptr_t pdVar27;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  optional_idx dict_size;
  undefined1 in_stack_ffffffffffffff48;
  undefined1 local_a8 [16];
  Vector *local_98;
  idx_t local_90;
  uint *local_88;
  idx_t local_80;
  UnifiedVectorFormat local_78;
  undefined1 auVar29 [16];
  
  local_78.sel = (SelectionVector *)state[1]._vptr_ExpressionState;
  optional_ptr<duckdb::FunctionLocalState,_true>::CheckValid
            ((optional_ptr<duckdb::FunctionLocalState,_true> *)&local_78);
  ArenaAllocator::Reset((ArenaAllocator *)&(local_78.sel)->selection_data);
  vector = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  count = args->count;
  VVar2 = vector->vector_type;
  if (VVar2 == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    psVar7 = (string_t *)result->data;
    puVar4 = (uint *)vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_int,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_int>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_int_const&)_1_>
              (puVar4,psVar7,count,&vector->validity,&result->validity,in_R9,
               (bool)in_stack_ffffffffffffff48);
    return;
  }
  if (VVar2 != DICTIONARY_VECTOR) {
    if (VVar2 == CONSTANT_VECTOR) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
      puVar4 = (uint *)result->data;
      puVar5 = (uint *)vector->data;
      puVar6 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar6 != (unsigned_long *)0x0) && ((*puVar6 & 1) == 0)) {
        ConstantVector::SetNull(result,true);
        return;
      }
      ConstantVector::SetNull(result,false);
      uVar3 = *puVar5;
      auVar30 = ZEXT716(CONCAT52(CONCAT41((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar3 >> 0x10),uVar3)) >> 0x20),
                                                  uVar3) >> 0x18),(char)(uVar3 >> 8)),
                                 (ushort)(byte)uVar3) & 0xffffff00ffffff);
      auVar30 = pshuflw(auVar30,auVar30,0xdb);
      sVar10 = auVar30._0_2_;
      sVar11 = auVar30._2_2_;
      sVar12 = auVar30._4_2_;
      sVar13 = auVar30._6_2_;
      uVar14 = (uint)DAT_01399980;
      *puVar4 = uVar3 & 0xff;
      puVar4[1] = CONCAT13((0 < sVar13) * (sVar13 < 0x100) * auVar30[6] - (0xff < sVar13),
                           CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar30[4] - (0xff < sVar12),
                                    CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar30[2] -
                                             (0xff < sVar11),
                                             (0 < sVar10) * (sVar10 < 0x100) * auVar30[0] -
                                             (0xff < sVar10)))) & uVar14;
      puVar4[2] = 0;
      puVar4[3] = 0;
      return;
    }
    goto LAB_00916e10;
  }
  DictionaryVector::VerifyDictionary(vector);
  pVVar21 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
  local_78.sel = (SelectionVector *)pVVar21[1].data.allocator.ptr;
  if (((Allocator *)local_78.sel == (Allocator *)0xffffffffffffffff) ||
     (iVar24 = optional_idx::GetIndex((optional_idx *)&local_78), count < iVar24 * 2)) {
LAB_00916e06:
    bVar15 = false;
  }
  else {
    DictionaryVector::VerifyDictionary(vector);
    pVVar21 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->auxiliary);
    if (*(char *)&pVVar21[1]._vptr_VectorBuffer != '\0') goto LAB_00916e06;
    local_98 = (Vector *)(pVVar21 + 1);
    psVar7 = (string_t *)result->data;
    local_88 = (uint *)pVVar21[1].data.pointer;
    local_90 = optional_idx::GetIndex((optional_idx *)&local_78);
    FlatVector::VerifyFlatVector(local_98);
    FlatVector::VerifyFlatVector(result);
    UnaryExecutor::
    ExecuteFlat<unsigned_int,duckdb::string_t,duckdb::UnaryLambdaWrapper,duckdb::StringDecompressFunction<unsigned_int>(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::_lambda(unsigned_int_const&)_1_>
              (local_88,psVar7,local_90,(ValidityMask *)&pVVar21[1].data.allocated_size,
               &result->validity,in_R9,(bool)in_stack_ffffffffffffff48);
    DictionaryVector::VerifyDictionary(vector);
    pVVar21 = shared_ptr<duckdb::VectorBuffer,_true>::operator->(&vector->buffer);
    iVar24 = optional_idx::GetIndex((optional_idx *)&local_78);
    Vector::Dictionary(result,result,iVar24,(SelectionVector *)(pVVar21 + 1),count);
    bVar15 = true;
  }
  if (bVar15) {
    return;
  }
LAB_00916e10:
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(vector,count,&local_78);
  Vector::SetVectorType(result,FLAT_VECTOR);
  pSVar20 = local_78.sel;
  pdVar27 = result->data;
  FlatVector::VerifyFlatVector(result);
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    if (count != 0) {
      p_Var8 = (allocate_function_ptr_t)pSVar20->sel_vector;
      pdVar27 = pdVar27 + 8;
      iVar24 = 0;
      do {
        iVar25 = iVar24;
        if (p_Var8 != (allocate_function_ptr_t)0x0) {
          iVar25 = (idx_t)*(uint *)(p_Var8 + iVar24 * 4);
        }
        uVar3 = *(uint *)(local_78.data + iVar25 * 4);
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)(
                                                  uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)(uVar3 >> 0x10),uVar3)) >> 0x20),
                                                  uVar3) >> 0x18),
                                             CONCAT12((char)(uVar3 >> 8),(short)uVar3)) >> 0x10),
                             (short)uVar3) & 0xffff00ff00ff00ff;
        auVar30 = pshuflw(auVar30,auVar30,0xdb);
        sVar10 = auVar30._0_2_;
        sVar11 = auVar30._2_2_;
        sVar12 = auVar30._4_2_;
        *(uint *)(pdVar27 + -8) = uVar3 & 0xff;
        *(uint *)(pdVar27 + -4) =
             (uint)CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar30[4] - (0xff < sVar12),
                            CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar30[2] - (0xff < sVar11),
                                     (0 < sVar10) * (sVar10 < 0x100) * auVar30[0] - (0xff < sVar10))
                           );
        pdVar27[0] = '\0';
        pdVar27[1] = '\0';
        pdVar27[2] = '\0';
        pdVar27[3] = '\0';
        pdVar27[4] = '\0';
        pdVar27[5] = '\0';
        pdVar27[6] = '\0';
        pdVar27[7] = '\0';
        iVar24 = iVar24 + 1;
        pdVar27 = pdVar27 + 0x10;
      } while (count != iVar24);
    }
  }
  else if (count != 0) {
    p_Var8 = (allocate_function_ptr_t)pSVar20->sel_vector;
    pdVar27 = pdVar27 + 8;
    uVar26 = 0;
    do {
      uVar22 = uVar26;
      if (p_Var8 != (allocate_function_ptr_t)0x0) {
        uVar22 = (ulong)*(uint *)(p_Var8 + uVar26 * 4);
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar22 >> 6]
           >> (uVar22 & 0x3f) & 1) == 0) {
        if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
            (unsigned_long *)0x0) {
          local_80 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_a8,&local_80);
          uVar18 = local_a8._0_8_;
          uVar19 = local_a8._8_8_;
          local_a8 = (undefined1  [16])0x0;
          this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)uVar18;
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar19;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._8_8_);
          }
          pTVar23 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(result->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)
               (pTVar23->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar9 = (byte)uVar26 & 0x3f;
        puVar1 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                 (uVar26 >> 6);
        *puVar1 = *puVar1 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
      }
      else {
        uVar3 = *(uint *)(local_78.data + uVar22 * 4);
        auVar17._1_9_ = SUB169(ZEXT816(0) << 0x40,7);
        auVar17[0] = (char)(uVar3 >> 0x18);
        auVar17._10_6_ = 0;
        auVar29._5_11_ = SUB1611(auVar17 << 0x30,5);
        auVar29[4] = (char)(uVar3 >> 0x10);
        auVar29._0_4_ = uVar3;
        auVar16._12_4_ = 0;
        auVar16._0_12_ = auVar29._4_12_;
        auVar28._3_13_ = SUB1613(auVar16 << 0x20,3);
        auVar28[2] = (char)(uVar3 >> 8);
        auVar28[0] = (byte)uVar3;
        auVar28[1] = 0;
        auVar30 = pshuflw(auVar28,auVar28,0xdb);
        sVar10 = auVar30._0_2_;
        sVar11 = auVar30._2_2_;
        sVar12 = auVar30._4_2_;
        *(uint *)(pdVar27 + -8) = uVar3 & 0xff;
        *(uint *)(pdVar27 + -4) =
             (uint)CONCAT12((0 < sVar12) * (sVar12 < 0x100) * auVar30[4] - (0xff < sVar12),
                            CONCAT11((0 < sVar11) * (sVar11 < 0x100) * auVar30[2] - (0xff < sVar11),
                                     (0 < sVar10) * (sVar10 < 0x100) * auVar30[0] - (0xff < sVar10))
                           );
        pdVar27[0] = '\0';
        pdVar27[1] = '\0';
        pdVar27[2] = '\0';
        pdVar27[3] = '\0';
        pdVar27[4] = '\0';
        pdVar27[5] = '\0';
        pdVar27[6] = '\0';
        pdVar27[7] = '\0';
      }
      uVar26 = uVar26 + 1;
      pdVar27 = pdVar27 + 0x10;
    } while (count != uVar26);
  }
  if (local_78.owned_sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.owned_sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

static void StringDecompressFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &allocator = ExecuteFunctionState::GetFunctionState(state)->Cast<StringDecompressLocalState>().allocator;
	allocator.Reset();
	UnaryExecutor::Execute<INPUT_TYPE, string_t>(
	    args.data[0], result, args.size(),
	    [&](const INPUT_TYPE &input) { return StringDecompress<INPUT_TYPE>(input, allocator); },
	    FunctionErrors::CANNOT_ERROR);
}